

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O1

void RigidBodyDynamics::ComputeConstraintImpulsesRangeSpaceSparse
               (Model *model,VectorNd *Q,VectorNd *QDotMinus,ConstraintSet *CS,VectorNd *QDotPlus)

{
  ConstraintSet *H;
  LinearSolver linear_solver;
  void *local_50 [2];
  ConstraintSet *local_40;
  VectorNd *local_38;
  
  UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  H = CS + 0x160;
  CompositeRigidBodyAlgorithm(model,Q,(MatrixNd *)H,false);
  CalcConstraintsJacobian(model,Q,CS,(MatrixNd *)(CS + 0x198),false);
  linear_solver = 0x13d32b;
  local_40 = H;
  local_38 = QDotMinus;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_50,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)&local_40);
  SolveConstrainedSystemRangeSpaceSparse
            (model,(MatrixNd *)H,(MatrixNd *)(CS + 0x198),(VectorNd *)local_50,
             (VectorNd *)(CS + 0x150),QDotPlus,(VectorNd *)(CS + 0x140),(MatrixNd *)(CS + 0x4f0),
             (VectorNd *)(CS + 0x508),linear_solver);
  free(local_50[0]);
  return;
}

Assistant:

RBDL_DLLAPI
void ComputeConstraintImpulsesRangeSpaceSparse (
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDotMinus,
  ConstraintSet &CS,
  Math::VectorNd &QDotPlus
)
{

  // Compute H
  UpdateKinematicsCustom (model, &Q, NULL, NULL);
  CompositeRigidBodyAlgorithm (model, Q, CS.H, false);

  // Compute G
  CalcConstraintsJacobian (model, Q, CS, CS.G, false);

  SolveConstrainedSystemRangeSpaceSparse (model, CS.H, CS.G, CS.H * QDotMinus
                                          , CS.v_plus, QDotPlus, CS.impulse, CS.K, CS.a, CS.linear_solver);

}